

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::Pipeline::SerializeWithCachedSizes(Pipeline *this,CodedOutputStream *output)

{
  int iVar1;
  char *data;
  Type *value;
  Type *pTVar2;
  int iVar3;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  
  iVar1 = (this->models_).super_RepeatedPtrFieldBase.current_size_;
  for (iVar3 = 0; iVar1 != iVar3; iVar3 = iVar3 + 1) {
    value = google::protobuf::internal::RepeatedPtrFieldBase::
            Get<google::protobuf::RepeatedPtrField<CoreML::Specification::Model>::TypeHandler>
                      (&(this->models_).super_RepeatedPtrFieldBase,iVar3);
    google::protobuf::internal::WireFormatLite::WriteMessage(1,&value->super_MessageLite,output);
  }
  iVar1 = (this->names_).super_RepeatedPtrFieldBase.current_size_;
  this_00 = &this->names_;
  iVar3 = 0;
  if (iVar1 < 1) {
    iVar1 = iVar3;
  }
  for (; iVar1 != iVar3; iVar3 = iVar3 + 1) {
    pTVar2 = google::protobuf::internal::RepeatedPtrFieldBase::
             Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                       (&this_00->super_RepeatedPtrFieldBase,iVar3);
    data = (pTVar2->_M_dataplus)._M_p;
    pTVar2 = google::protobuf::internal::RepeatedPtrFieldBase::
             Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                       (&this_00->super_RepeatedPtrFieldBase,iVar3);
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              (data,(int)pTVar2->_M_string_length,SERIALIZE,"CoreML.Specification.Pipeline.names");
    pTVar2 = google::protobuf::internal::RepeatedPtrFieldBase::
             Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                       (&this_00->super_RepeatedPtrFieldBase,iVar3);
    google::protobuf::internal::WireFormatLite::WriteString(2,pTVar2,output);
  }
  return;
}

Assistant:

void Pipeline::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.Pipeline)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // repeated .CoreML.Specification.Model models = 1;
  for (unsigned int i = 0, n = this->models_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      1, this->models(i), output);
  }

  // repeated string names = 2;
  for (int i = 0, n = this->names_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
      this->names(i).data(), this->names(i).length(),
      ::google::protobuf::internal::WireFormatLite::SERIALIZE,
      "CoreML.Specification.Pipeline.names");
    ::google::protobuf::internal::WireFormatLite::WriteString(
      2, this->names(i), output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.Pipeline)
}